

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  void *pvVar4;
  float *pfVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  ulong uVar12;
  void *pvVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int i_1;
  ulong uVar18;
  void *pvVar19;
  int iVar20;
  void *pvVar21;
  int p;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  undefined1 extraout_var [12];
  undefined1 auVar28 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 in_XMM4 [16];
  float *outptr;
  Mat local_f0;
  undefined1 local_a8 [16];
  long local_90;
  long local_88;
  void *local_80;
  Option opt_g;
  
  uVar22 = this->weight_data_size / this->num_output;
  uVar1 = bottom_blob->c;
  local_f0.elemsize = bottom_blob->elemsize;
  local_f0.data = bottom_blob->data;
  local_f0.refcount = bottom_blob->refcount;
  local_f0.elempack = bottom_blob->elempack;
  local_f0.allocator = bottom_blob->allocator;
  local_f0.dims = bottom_blob->dims;
  local_f0.w = bottom_blob->w;
  local_f0.h = bottom_blob->h;
  local_f0.d = bottom_blob->d;
  uVar25 = bottom_blob->w;
  uVar14 = bottom_blob->h;
  uVar24 = (ulong)uVar14;
  local_f0.cstep = bottom_blob->cstep;
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + 1;
    UNLOCK();
  }
  local_f0.c = uVar1;
  if (local_f0.elemsize != 1) {
    opt_g.lightmode = opt->lightmode;
    opt_g.use_shader_pack8 = opt->use_shader_pack8;
    opt_g.use_subgroup_ops = opt->use_subgroup_ops;
    opt_g.use_reserved_0 = opt->use_reserved_0;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator = opt->workspace_allocator;
    opt_g.openmp_blocktime = opt->openmp_blocktime;
    opt_g.use_winograd_convolution = opt->use_winograd_convolution;
    opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_g.use_int8_inference = opt->use_int8_inference;
    opt_g.use_vulkan_compute = opt->use_vulkan_compute;
    uVar16._0_1_ = opt->use_bf16_storage;
    uVar16._1_1_ = opt->use_fp16_packed;
    uVar16._2_1_ = opt->use_fp16_storage;
    uVar16._3_1_ = opt->use_fp16_arithmetic;
    uVar16._4_1_ = opt->use_int8_packed;
    uVar16._5_1_ = opt->use_int8_storage;
    uVar16._6_1_ = opt->use_int8_arithmetic;
    uVar16._7_1_ = opt->use_packing_layout;
    opt_g.vulkan_device_index = opt->vulkan_device_index;
    opt_g.use_reserved_1 = opt->use_reserved_1;
    opt_g.use_image_storage = opt->use_image_storage;
    opt_g.use_tensor_storage = opt->use_tensor_storage;
    opt_g.use_reserved_2 = opt->use_reserved_2;
    opt_g.flush_denormals = opt->flush_denormals;
    opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_g.use_shader_local_memory = opt->use_shader_local_memory;
    opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_g.use_fp16_uniform = opt->use_fp16_uniform;
    opt_g.use_int8_uniform = opt->use_int8_uniform;
    opt_g.use_reserved_9 = opt->use_reserved_9;
    opt_g.use_reserved_10 = opt->use_reserved_10;
    opt_g.use_reserved_11 = opt->use_reserved_11;
    opt_g.blob_allocator = opt->workspace_allocator;
    opt_g._32_8_ = uVar16 & 0xffffffffffffff;
    quantize_to_int8(bottom_blob,&local_f0,&this->bottom_blob_int8_scales,&opt_g);
  }
  iVar20 = -100;
  if ((bottom_blob->dims == 2) && (uVar25 == uVar22)) {
    Mat::create(top_blob,this->num_output,uVar14,4,opt->blob_allocator);
    local_80 = top_blob->data;
    if ((local_80 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_002869c5;
    local_88 = (long)top_blob->w * top_blob->elemsize;
    uVar16 = 0;
    if (0 < (int)uVar22) {
      uVar16 = (ulong)uVar22;
    }
    uVar1 = this->num_output;
    if (this->num_output < 1) {
      uVar1 = 0;
    }
    if ((int)uVar14 < 1) {
      uVar24 = 0;
    }
    local_90 = (long)local_f0.w * local_f0.elemsize;
    uVar23 = 0;
    pvVar21 = local_f0.data;
    while (pvVar6 = local_80, uVar23 != uVar24) {
      local_a8._0_8_ = uVar23;
      lVar15 = local_88 * uVar23;
      pvVar19 = (this->weight_data).data;
      pvVar13 = (this->weight_data_int8_scales).data;
      pfVar3 = (float *)(this->bottom_blob_int8_scales).data;
      iVar20 = this->bias_term;
      iVar2 = this->activation_type;
      pvVar4 = (this->bias_data).data;
      pfVar5 = (float *)(this->activation_params).data;
      for (uVar23 = 0; uVar23 != uVar1; uVar23 = uVar23 + 1) {
        iVar11 = 0;
        for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
          iVar11 = iVar11 + (int)*(char *)((long)pvVar19 + uVar12) *
                            (int)*(char *)((long)pvVar21 + uVar12);
        }
        fVar27 = *(float *)((long)pvVar13 + uVar23 * 4);
        fVar26 = 0.0;
        if (fVar27 != 0.0) {
          fVar26 = 1.0 / (fVar27 * *pfVar3);
        }
        fVar26 = (float)iVar11 * fVar26;
        if (iVar20 != 0) {
          fVar26 = fVar26 + *(float *)((long)pvVar4 + uVar23 * 4);
        }
        in_XMM4._0_4_ = fVar26;
        auVar28 = in_XMM4;
        switch(iVar2) {
        case 1:
          if (fVar26 <= 0.0) {
            auVar9._12_4_ = 0;
            auVar9._0_12_ = in_XMM4._4_12_;
            auVar28 = auVar9 << 0x20;
            in_XMM4 = auVar28;
          }
          break;
        case 2:
          auVar28 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar26) & (uint)*pfVar5 |
                                          -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26));
          break;
        case 3:
          if (fVar26 <= *pfVar5) {
            in_XMM4._0_4_ = *pfVar5;
          }
          fVar26 = pfVar5[1];
          auVar28 = in_XMM4;
          if (fVar26 < in_XMM4._0_4_) {
LAB_002866d5:
            auVar28 = ZEXT416((uint)fVar26);
          }
          break;
        case 4:
          if (88.37626 <= fVar26) {
            in_XMM4._0_4_ = 0x42b0c0a5;
          }
          uVar25 = -(uint)(in_XMM4._0_4_ < -88.37626);
          auVar7._4_4_ = ~in_XMM4._4_4_ & (in_XMM4._4_4_ ^ 0x80000000);
          auVar7._0_4_ = ~uVar25 & (uint)-in_XMM4._0_4_;
          auVar7._8_4_ = ~in_XMM4._8_4_ & (in_XMM4._8_4_ ^ 0x80000000);
          auVar7._12_4_ = ~in_XMM4._12_4_ & (in_XMM4._12_4_ ^ 0x80000000);
          in_XMM4 = ZEXT416(uVar25 & 0x42b0c0a5) | auVar7;
          fVar27 = expf(in_XMM4._0_4_);
          auVar28 = ZEXT416((uint)(1.0 / (fVar27 + 1.0)));
          break;
        case 5:
          fVar27 = expf(fVar26);
          fVar27 = logf(fVar27 + 1.0);
          fVar27 = tanhf(fVar27);
          auVar28._0_4_ = fVar27 * fVar26;
          auVar28._4_12_ = extraout_var;
          break;
        case 6:
          fVar27 = *pfVar5;
          fVar30 = -pfVar5[1] / fVar27;
          auVar28 = ZEXT816(0);
          if ((fVar30 <= fVar26) && (auVar28 = in_XMM4, fVar26 <= fVar30 + 1.0 / fVar27)) {
            fVar26 = (fVar27 * fVar26 + pfVar5[1]) * fVar26;
            goto LAB_002866d5;
          }
        }
        *(int *)((long)pvVar6 + uVar23 * 4 + lVar15) = auVar28._0_4_;
        pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar22);
      }
      pvVar21 = (void *)((long)pvVar21 + local_90);
      uVar23 = local_a8._0_8_ + 1;
    }
  }
  else {
    Mat::create(top_blob,this->num_output,4,opt->blob_allocator);
    pvVar21 = top_blob->data;
    if ((pvVar21 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_002869c5;
    uVar14 = uVar14 * uVar25;
    pvVar6 = (this->weight_data_int8_scales).data;
    pfVar3 = (float *)(this->bottom_blob_int8_scales).data;
    iVar20 = this->bias_term;
    pvVar19 = (this->bias_data).data;
    iVar2 = this->activation_type;
    pfVar5 = (float *)(this->activation_params).data;
    uVar24 = 0;
    if (0 < (int)uVar14) {
      uVar24 = (ulong)uVar14;
    }
    uVar25 = uVar1;
    if ((int)uVar1 < 1) {
      uVar25 = 0;
    }
    uVar16 = (ulong)(uint)this->num_output;
    if (this->num_output < 1) {
      uVar16 = 0;
    }
    lVar15 = 0;
    for (uVar23 = 0; uVar23 != uVar16; uVar23 = uVar23 + 1) {
      lVar17 = (long)(this->weight_data).data + lVar15;
      iVar11 = 0;
      pvVar13 = local_f0.data;
      for (uVar12 = 0; uVar12 != uVar25; uVar12 = uVar12 + 1) {
        for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
          iVar11 = iVar11 + (int)*(char *)(lVar17 + uVar18) * (int)*(char *)((long)pvVar13 + uVar18)
          ;
        }
        lVar17 = lVar17 + (int)uVar14;
        pvVar13 = (void *)((long)pvVar13 + local_f0.cstep * local_f0.elemsize);
      }
      fVar27 = *(float *)((long)pvVar6 + uVar23 * 4);
      fVar26 = 0.0;
      if (fVar27 != 0.0) {
        fVar26 = 1.0 / (fVar27 * *pfVar3);
      }
      fVar26 = (float)iVar11 * fVar26;
      if (iVar20 != 0) {
        fVar26 = fVar26 + *(float *)((long)pvVar19 + uVar23 * 4);
      }
      in_XMM4._0_4_ = fVar26;
      auVar29 = in_XMM4;
      switch(iVar2) {
      case 1:
        if (fVar26 <= 0.0) {
          auVar10._12_4_ = 0;
          auVar10._0_12_ = in_XMM4._4_12_;
          auVar29 = auVar10 << 0x20;
          in_XMM4 = auVar29;
        }
        break;
      case 2:
        auVar29 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar26) & (uint)*pfVar5 |
                                        -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26));
        break;
      case 3:
        if (fVar26 <= *pfVar5) {
          in_XMM4._0_4_ = *pfVar5;
        }
        fVar26 = pfVar5[1];
        auVar29 = in_XMM4;
        if (fVar26 < in_XMM4._0_4_) {
LAB_002869a7:
          auVar29 = ZEXT416((uint)fVar26);
        }
        break;
      case 4:
        if (88.37626 <= fVar26) {
          in_XMM4._0_4_ = 0x42b0c0a5;
        }
        uVar22 = -(uint)(in_XMM4._0_4_ < -88.37626);
        auVar8._4_4_ = ~in_XMM4._4_4_ & (in_XMM4._4_4_ ^ 0x80000000);
        auVar8._0_4_ = ~uVar22 & (uint)-in_XMM4._0_4_;
        auVar8._8_4_ = ~in_XMM4._8_4_ & (in_XMM4._8_4_ ^ 0x80000000);
        auVar8._12_4_ = ~in_XMM4._12_4_ & (in_XMM4._12_4_ ^ 0x80000000);
        in_XMM4 = ZEXT416(uVar22 & 0x42b0c0a5) | auVar8;
        fVar27 = expf(in_XMM4._0_4_);
        auVar29 = ZEXT416((uint)(1.0 / (fVar27 + 1.0)));
        break;
      case 5:
        local_a8 = in_XMM4;
        fVar27 = expf(fVar26);
        fVar27 = logf(fVar27 + 1.0);
        fVar27 = tanhf(fVar27);
        auVar29._0_4_ = fVar27 * (float)local_a8._0_4_;
        auVar29._4_12_ = extraout_var_00;
        break;
      case 6:
        fVar27 = *pfVar5;
        fVar30 = -pfVar5[1] / fVar27;
        auVar29 = ZEXT816(0);
        if ((fVar30 <= fVar26) && (auVar29 = in_XMM4, fVar26 <= fVar30 + 1.0 / fVar27)) {
          fVar26 = (fVar27 * fVar26 + pfVar5[1]) * fVar26;
          goto LAB_002869a7;
        }
      }
      *(int *)((long)pvVar21 + uVar23 * 4) = auVar29._0_4_;
      lVar15 = lVar15 + (int)(uVar14 * uVar1);
    }
  }
  iVar20 = 0;
LAB_002869c5:
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if (*local_f0.refcount == 0) {
      if (local_f0.allocator == (Allocator *)0x0) {
        free(local_f0.data);
      }
      else {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;
        opt_g.use_packing_layout = false;

        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_g);
    }

    if (bottom_blob.dims == 2 && w == num_input)
    {
        // gemm
        top_blob.create(num_output, h, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const signed char* m = bottom_blob_int8.row<signed char>(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const signed char* kptr = (const signed char*)weight_data + w * p;
                int sum = 0;

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }
                // dequantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        int offset = size * channels * p;
        // channels
        for (int q = 0; q < channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + offset + size * q;
            const signed char* m = bottom_blob_int8.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
    }

    return 0;
}